

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall
QHttpNetworkRequestPrivate::~QHttpNetworkRequestPrivate(QHttpNetworkRequestPrivate *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->peerVerifyName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->fullLocalServerName).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->customVerb).d);
  QHttpNetworkHeaderPrivate::~QHttpNetworkHeaderPrivate(&this->super_QHttpNetworkHeaderPrivate);
  return;
}

Assistant:

QHttpNetworkRequestPrivate::~QHttpNetworkRequestPrivate()
{
}